

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_io.c
# Opt level: O0

int IDASetEtaFixedStepBounds(void *ida_mem,sunrealtype eta_min_fx,sunrealtype eta_max_fx)

{
  long in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == 0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x54,"IDASetEtaFixedStepBounds",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/ida/ida_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else {
    if ((in_XMM0_Qa < 0.0) || (1.0 < in_XMM0_Qa)) {
      *(undefined8 *)(in_RDI + 0x330) = 0x3ff0000000000000;
    }
    else {
      *(double *)(in_RDI + 0x330) = in_XMM0_Qa;
    }
    if (in_XMM1_Qa < 1.0) {
      *(undefined8 *)(in_RDI + 0x328) = 0x4000000000000000;
    }
    else {
      *(double *)(in_RDI + 0x328) = in_XMM1_Qa;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDASetEtaFixedStepBounds(void* ida_mem, sunrealtype eta_min_fx,
                             sunrealtype eta_max_fx)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* set allowed value or use default */
  if (eta_min_fx >= ZERO && eta_min_fx <= ONE)
  {
    IDA_mem->ida_eta_min_fx = eta_min_fx;
  }
  else { IDA_mem->ida_eta_min_fx = ETA_MIN_FX_DEFAULT; }

  if (eta_max_fx >= ONE) { IDA_mem->ida_eta_max_fx = eta_max_fx; }
  else { IDA_mem->ida_eta_max_fx = ETA_MAX_FX_DEFAULT; }

  return (IDA_SUCCESS);
}